

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O3

void __thiscall raptor::Thread::Join(Thread *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  IThreadService *pIVar2;
  
  pIVar2 = this->_impl;
  if (pIVar2 == (IThreadService *)0x0) {
    if (this->_state != kFailed) {
      Join();
      pIVar2[2]._vptr_IThreadService = (_func_int **)0x0;
      pIVar2[3]._vptr_IThreadService = (_func_int **)0x0;
      pIVar2->_vptr_IThreadService = (_func_int **)0x0;
      pIVar2[1]._vptr_IThreadService = (_func_int **)0x0;
      if (*(code **)(in_RSI + 0x10) != (code *)0x0) {
        (**(code **)(in_RSI + 0x10))();
        pp_Var1 = *(_func_int ***)(in_RSI + 0x18);
        pIVar2[2]._vptr_IThreadService = *(_func_int ***)(in_RSI + 0x10);
        pIVar2[3]._vptr_IThreadService = pp_Var1;
      }
      return;
    }
  }
  else {
    if (this->_state == kAlive) {
      this->_state = kActive;
      (*pIVar2->_vptr_IThreadService[2])();
      pIVar2 = this->_impl;
    }
    (*pIVar2->_vptr_IThreadService[3])();
    if (this->_impl != (IThreadService *)0x0) {
      (*this->_impl->_vptr_IThreadService[1])();
    }
    this->_state = kFinish;
    this->_impl = (IThreadService *)0x0;
  }
  return;
}

Assistant:

void Thread::Join() {
    if (_impl != nullptr) {
        if (_state == kAlive) {
            _state = kActive;
            _impl->Start();
        }
        _impl->Join();
        delete _impl;
        _state = kFinish;
        _impl = nullptr;
    } else {
        RAPTOR_ASSERT(_state == kFailed);
    }
}